

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-fixed-contact-dynamical-system.cpp
# Opt level: O3

Vector __thiscall
stateObservation::flexibilityEstimation::IMUFixedContactDynamicalSystem::stateDynamics
          (IMUFixedContactDynamicalSystem *this,Vector *x,Vector *param_2,TimeIndex param_3)

{
  _func_int **pp_Var1;
  long lVar2;
  double *pdVar3;
  _func_int *p_Var4;
  double dVar5;
  double dVar6;
  char cVar7;
  ulong uVar8;
  char *__function;
  Index extraout_RDX;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double extraout_XMM0_Qb;
  double dVar16;
  undefined1 auVar15 [16];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  Vector VVar22;
  Vector xk1;
  Vector3 orientationFlexV;
  Quaternion orientationFlex;
  AngleAxis orientationAA;
  DenseStorage<double,__1,__1,_1,_0> local_1b8;
  Vector3 local_1a8;
  double local_188;
  double local_180;
  double local_178;
  undefined8 uStack_170;
  _func_int *local_168;
  _func_int *p_Stack_160;
  _func_int *local_158;
  _func_int *local_148;
  _func_int *p_Stack_140;
  _func_int *local_138;
  undefined1 local_128 [16];
  _func_int *local_118;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  undefined1 local_e8 [24];
  double local_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  Quaternion local_a8;
  double local_88;
  double dStack_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  double dStack_60;
  AngleAxis<double> local_58;
  
  cVar7 = (*(code *)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data[8])(x,param_2);
  if (cVar7 == '\0') {
    __assert_fail("checkStateVector(v) && \"ERROR: The state vector has the wrong size\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/dynamical-system/dynamical-system-functor-base.hpp"
                  ,0x40,
                  "void stateObservation::DynamicalSystemFunctorBase::assertStateVector_(const Vector &)"
                 );
  }
  lVar2 = (param_2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
  ;
  if (((2 < lVar2) && (uVar8 = lVar2 - 3, 5 < uVar8)) && (0xb < uVar8)) {
    pdVar3 = (param_2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    local_68 = *pdVar3;
    dStack_60 = pdVar3[1];
    local_d0 = pdVar3[2];
    local_f8 = pdVar3[6];
    dStack_f0 = pdVar3[7];
    local_e8._0_8_ = pdVar3[8];
    local_108 = pdVar3[0xc];
    dStack_100 = pdVar3[0xd];
    local_178 = pdVar3[0xe];
    local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array.
    _0_16_ = *(undefined1 (*) [16])(pdVar3 + 3);
    local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = pdVar3[5];
    if (0xe < uVar8) {
      local_180 = pdVar3[0xb];
      local_b8 = pdVar3[9];
      dStack_b0 = pdVar3[10];
      local_c8 = pdVar3[0xf];
      dStack_c0 = pdVar3[0x10];
      local_188 = pdVar3[0x11];
      computeQuaternion_(&local_a8,(IMUFixedContactDynamicalSystem *)x,&local_1a8);
      local_88 = (double)x[0x12].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows;
      dVar17 = local_88 * 0.5 * local_88;
      dVar5 = dStack_60 + dStack_100 * dVar17 + dStack_f0 * local_88;
      local_128._8_4_ = SUB84(dVar5,0);
      local_128._0_8_ = local_68 + local_108 * dVar17 + local_f8 * local_88;
      local_128._12_4_ = (int)((ulong)dVar5 >> 0x20);
      local_118 = (_func_int *)(local_d0 + local_178 * dVar17 + (double)local_e8._0_8_ * local_88);
      local_148 = (_func_int *)(local_108 * local_88 + local_f8);
      p_Stack_140 = (_func_int *)(dStack_100 * local_88 + dStack_f0);
      local_138 = (_func_int *)(local_178 * local_88 + (double)local_e8._0_8_);
      auVar20._0_8_ = dVar17 * local_c8 + local_b8 * local_88;
      auVar20._8_8_ = dVar17 * dStack_c0 + dStack_b0 * local_88;
      local_178 = dVar17 * local_188 + local_180 * local_88;
      dVar5 = local_178 * local_178 + auVar20._8_8_ * auVar20._8_8_ + auVar20._0_8_ * auVar20._0_8_;
      dVar17 = SQRT(dVar5);
      uStack_70 = 0;
      if (9.999999999999999e-33 < dVar5) {
        auVar18._8_8_ = dVar17;
        auVar18._0_8_ = dVar17;
        local_e8._0_16_ = divpd(auVar20,auVar18);
        local_178 = local_178 / dVar17;
      }
      else {
        local_e8._0_16_ = ZEXT816(0);
        local_178 = 1.0;
      }
      uStack_170 = 0;
      local_108 = (double)(-(ulong)(9.999999999999999e-33 < dVar5) & (ulong)(dVar17 * 0.5));
      dStack_100 = 0.0;
      dStack_80 = local_88;
      local_78 = local_88;
      local_f8 = cos(local_108);
      dStack_f0 = extraout_XMM0_Qb;
      dVar12 = sin(local_108);
      dVar21 = local_178 * dVar12;
      dVar13 = dVar12 * (double)local_e8._0_8_;
      dVar12 = dVar12 * (double)local_e8._8_8_;
      dVar14 = dVar12 * local_a8.m_coeffs.
                        super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                        m_data.array[0];
      dVar16 = dVar12 * local_a8.m_coeffs.
                        super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                        m_data.array[1];
      dVar5 = dVar13 * local_a8.m_coeffs.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
                       .array[0];
      dVar17 = dVar13 * local_a8.m_coeffs.
                        super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                        m_data.array[1];
      dVar6 = local_a8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array[0] * dVar21 -
              local_a8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array[2] * dVar13;
      auVar19._8_4_ = SUB84(dVar6,0);
      auVar19._0_8_ =
           local_a8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
           m_data.array[1] * dVar21 -
           local_a8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
           m_data.array[3] * dVar13;
      auVar19._12_4_ = (int)((ulong)dVar6 >> 0x20);
      local_a8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] =
           SUB168(auVar19 ^ _DAT_001987c0,0) +
           local_a8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
           m_data.array[2] * dVar12 +
           local_a8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
           m_data.array[0] * local_f8;
      local_a8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] =
           SUB168(auVar19 ^ _DAT_001987c0,8) +
           local_a8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
           m_data.array[3] * dVar12 +
           local_a8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
           m_data.array[1] * local_f8;
      dVar5 = dVar5 + dVar21 * local_a8.m_coeffs.
                               super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                               m_storage.m_data.array[2];
      auVar15._8_4_ = SUB84(dVar5,0);
      auVar15._0_8_ =
           dVar17 + dVar21 * local_a8.m_coeffs.
                             super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                             m_data.array[3];
      auVar15._12_4_ = (int)((ulong)dVar5 >> 0x20);
      local_a8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] =
           SUB168(auVar15 ^ _DAT_001987d0,0) +
           (local_f8 *
            local_a8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
            .m_data.array[2] - dVar14);
      local_a8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] =
           SUB168(auVar15 ^ _DAT_001987d0,8) +
           (local_f8 *
            local_a8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
            .m_data.array[3] - dVar16);
      local_168 = (_func_int *)(local_b8 + local_c8 * local_88);
      p_Stack_160 = (_func_int *)(dStack_b0 + dStack_c0 * dStack_80);
      local_158 = (_func_int *)(local_180 + local_188 * local_78);
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                (&local_1b8,(DenseStorage<double,__1,__1,_1,_0> *)param_2);
      pdVar3 = local_1b8.m_data;
      if (2 < local_1b8.m_rows) {
        if (((ulong)local_1b8.m_data & 7) == 0) {
          bVar11 = ((ulong)local_1b8.m_data & 8) != 0;
          if (bVar11) {
            *local_1b8.m_data = (double)local_128._0_8_;
            uVar10 = 3;
          }
          else {
            uVar10 = 2;
          }
          uVar9 = bVar11 | 2;
          if ((bVar11 | 2) < uVar10) {
            uVar9 = uVar10;
          }
          memcpy((void *)((long)local_1b8.m_data + (ulong)((uint)bVar11 * 8)),
                 local_128 + (uint)bVar11 * 8,
                 (ulong)((uVar9 + ~(uint)bVar11) * 8 & 0xfffffff0) + 0x10);
          if (((ulong)pdVar3 & 8) == 0) {
            uVar8 = (ulong)(uVar10 << 3);
            memcpy((void *)((long)pdVar3 + uVar8),local_128 + uVar8,uVar8 ^ 0x18);
          }
        }
        else {
          local_1b8.m_data[2] = (double)local_118;
          *local_1b8.m_data = (double)local_128._0_8_;
          local_1b8.m_data[1] = (double)local_128._8_8_;
        }
        pdVar3 = local_1b8.m_data;
        if (8 < local_1b8.m_rows) {
          pp_Var1 = (_func_int **)(local_1b8.m_data + 6);
          if (((ulong)pp_Var1 & 7) == 0) {
            bVar11 = ((ulong)pp_Var1 & 8) != 0;
            if (bVar11) {
              *pp_Var1 = local_148;
              uVar10 = 3;
            }
            else {
              uVar10 = 2;
            }
            uVar9 = bVar11 | 2;
            if ((bVar11 | 2) < uVar10) {
              uVar9 = uVar10;
            }
            memcpy((void *)((long)local_1b8.m_data + (ulong)((uint)bVar11 * 8) + 0x30),
                   (void *)((long)&local_148 + (ulong)((uint)bVar11 * 8)),
                   (ulong)((uVar9 + ~(uint)bVar11) * 8 & 0xfffffff0) + 0x10);
            if (((ulong)pp_Var1 & 8) == 0) {
              uVar8 = (ulong)(uVar10 << 3);
              memcpy((void *)((long)pdVar3 + uVar8 + 0x30),(void *)((long)&local_148 + uVar8),
                     uVar8 ^ 0x18);
            }
          }
          else {
            local_1b8.m_data[8] = (double)local_138;
            *pp_Var1 = local_148;
            local_1b8.m_data[7] = (double)p_Stack_140;
          }
          Eigen::AngleAxis<double>::operator=
                    (&local_58,(QuaternionBase<Eigen::Quaternion<double,_0>_> *)&local_a8);
          pdVar3 = local_1b8.m_data;
          p_Var4 = (_func_int *)
                   (local_58.m_angle *
                   local_58.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[0]);
          local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[2] = local_58.m_angle *
                     local_58.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[2];
          local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1]._0_4_ =
               SUB84(local_58.m_angle *
                     local_58.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[1],0);
          local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0] = p_Var4;
          local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1]._4_4_ =
               (int)((ulong)(local_58.m_angle *
                            local_58.m_axis.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                            m_data.array[1]) >> 0x20);
          if (5 < local_1b8.m_rows) {
            pp_Var1 = (_func_int **)(local_1b8.m_data + 3);
            if (((ulong)pp_Var1 & 7) == 0) {
              bVar11 = ((ulong)pp_Var1 & 8) != 0;
              if (bVar11) {
                *pp_Var1 = p_Var4;
                uVar10 = 3;
              }
              else {
                uVar10 = 2;
              }
              uVar9 = bVar11 | 2;
              if ((bVar11 | 2) < uVar10) {
                uVar9 = uVar10;
              }
              memcpy((void *)((long)local_1b8.m_data + (ulong)((uint)bVar11 * 8) + 0x18),
                     (void *)((long)local_1a8.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                    m_storage.m_data.array + (ulong)((uint)bVar11 * 8)),
                     (ulong)((uVar9 + ~(uint)bVar11) * 8 & 0xfffffff0) + 0x10);
              if (((ulong)pp_Var1 & 8) == 0) {
                uVar8 = (ulong)(uVar10 << 3);
                memcpy((void *)((long)pdVar3 + uVar8 + 0x18),
                       (void *)((long)local_1a8.
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                      m_storage.m_data.array + uVar8),uVar8 ^ 0x18);
              }
            }
            else {
              local_1b8.m_data[5] =
                   local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[2];
              *pp_Var1 = p_Var4;
              local_1b8.m_data[4] =
                   local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[1];
            }
            pdVar3 = local_1b8.m_data;
            if (0xb < local_1b8.m_rows) {
              pp_Var1 = (_func_int **)(local_1b8.m_data + 9);
              if (((ulong)pp_Var1 & 7) == 0) {
                bVar11 = ((ulong)pp_Var1 & 8) != 0;
                if (bVar11) {
                  *pp_Var1 = local_168;
                  uVar10 = 3;
                }
                else {
                  uVar10 = 2;
                }
                uVar9 = bVar11 | 2;
                if ((bVar11 | 2) < uVar10) {
                  uVar9 = uVar10;
                }
                memcpy((void *)((long)local_1b8.m_data + (ulong)((uint)bVar11 * 8) + 0x48),
                       (void *)((long)&local_168 + (ulong)((uint)bVar11 * 8)),
                       (ulong)((uVar9 + ~(uint)bVar11) * 8 & 0xfffffff0) + 0x10);
                if (((ulong)pp_Var1 & 8) == 0) {
                  uVar8 = (ulong)(uVar10 << 3);
                  memcpy((void *)((long)pdVar3 + uVar8 + 0x48),(void *)((long)&local_168 + uVar8),
                         uVar8 ^ 0x18);
                }
              }
              else {
                local_1b8.m_data[0xb] = (double)local_158;
                *pp_Var1 = local_168;
                local_1b8.m_data[10] = (double)p_Stack_160;
              }
              pdVar3 = x[0x12].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data;
              if (pdVar3 == (double *)0x0) {
                (this->super_DynamicalSystemFunctorBase)._vptr_DynamicalSystemFunctorBase =
                     (_func_int **)local_1b8.m_data;
                (this->sensor_).super_AlgebraicSensor.super_SensorBase._vptr_SensorBase =
                     (_func_int **)local_1b8.m_rows;
                local_1b8.m_data = (double *)0x0;
                local_1b8.m_rows = 0;
              }
              else {
                (**(code **)((long)*pdVar3 + 0x10))(this,pdVar3,&local_1b8);
              }
              free(local_1b8.m_data);
              VVar22.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                   = extraout_RDX;
              VVar22.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                   = (double *)this;
              return (Vector)VVar22.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage;
            }
          }
        }
      }
      __function = 
      "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
      ;
      goto LAB_001546f0;
    }
  }
  __function = 
  "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
  ;
LAB_001546f0:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
}

Assistant:

Vector IMUFixedContactDynamicalSystem::stateDynamics(const Vector & x, const Vector &, TimeIndex)
{
  assertStateVector_(x);

  Vector3 positionFlex(x.segment(indexes::pos, 3));
  Vector3 velocityFlex(x.segment(indexes::linVel, 3));
  Vector3 accelerationFlex(x.segment(indexes::linAcc, 3));

  Vector3 orientationFlexV(x.segment(indexes::ori, 3));
  Vector3 angularVelocityFlex(x.segment(indexes::angVel, 3));
  Vector3 angularAccelerationFlex(x.segment(indexes::angAcc, 3));

  Quaternion orientationFlex(computeQuaternion_(orientationFlexV));

  kine::integrateKinematics(positionFlex, velocityFlex, accelerationFlex, orientationFlex, angularVelocityFlex,
                            angularAccelerationFlex, dt_);

  // x_{k+1}
  Vector xk1(x);

  xk1.segment(indexes::pos, 3) = positionFlex;
  xk1.segment(indexes::linVel, 3) = velocityFlex;

  AngleAxis orientationAA(orientationFlex);
  orientationFlexV = orientationAA.angle() * orientationAA.axis();

  xk1.segment(indexes::ori, 3) = orientationFlexV;
  xk1.segment(indexes::angVel, 3) = angularVelocityFlex;

  if(processNoise_ != 0x0)
    return processNoise_->getNoisy(xk1);
  else
    return xk1;
}